

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.hpp
# Opt level: O2

void __thiscall
tcmalloc::CentralFreelist::ReleaseToSpans(CentralFreelist *this,FreeList *freelist,int N)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  Span *pSVar3;
  Span *pSVar4;
  uint __line;
  bool bVar5;
  undefined8 *puVar6;
  PageHeap *pPVar7;
  Span *span;
  uint64_t uVar8;
  uint64_t uVar9;
  char *__assertion;
  
  while( true ) {
    if (freelist->free_count_ == 0) {
      bVar5 = CheckState(this);
      if (bVar5) {
        return;
      }
      __assert_fail("CheckState()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                    ,0x89,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
    }
    puVar6 = (undefined8 *)FreeList::PopFront(freelist);
    pPVar7 = PageHeap::Instance();
    span = (Span *)PageMap::Get(&pPVar7->page_map_,(ulong)puVar6 >> 0xd);
    if (span->location != 0) break;
    if (span->size_class != (long)this->class_) {
      __assertion = "span->size_class == class_";
      __line = 0x78;
      goto LAB_0010a47a;
    }
    uVar8 = (span->freelist).free_count_;
    if (uVar8 == 0) {
      this->span_nums_ = this->span_nums_ - 1;
      pSVar3 = span->prev;
      pSVar4 = span->next;
      pSVar3->next = pSVar4;
      pSVar4->prev = pSVar3;
      span->prev = (Span *)0x0;
      span->next = (Span *)0x0;
      this->span_nums_ = this->span_nums_ + 1;
      span->prev = &this->nonempty_;
      pSVar3 = (this->nonempty_).next;
      span->next = pSVar3;
      pSVar3->prev = span;
      (this->nonempty_).next = span;
    }
    puVar1 = &span->refcount;
    *puVar1 = *puVar1 - 1;
    uVar2 = *puVar1;
    uVar9 = this->free_objects_ + 1;
    uVar8 = uVar8 + 1;
    this->free_objects_ = uVar9;
    *puVar6 = (span->freelist).head_;
    (span->freelist).head_ = puVar6;
    (span->freelist).free_count_ = uVar8;
    if (uVar2 == 0) {
      this->free_objects_ = uVar9 - (long)(int)uVar8;
      this->span_nums_ = this->span_nums_ - 1;
      pSVar3 = span->prev;
      pSVar4 = span->next;
      pSVar3->next = pSVar4;
      pSVar4->prev = pSVar3;
      span->prev = (Span *)0x0;
      span->next = (Span *)0x0;
      pPVar7 = PageHeap::Instance();
      PageHeap::Delete(pPVar7,span);
    }
  }
  __assertion = "span->location == Span::IN_USE";
  __line = 0x77;
LAB_0010a47a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                ,__line,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
}

Assistant:

void ReleaseToSpans(FreeList& freelist, int N) {
        while (!freelist.Empty()) {
            void* ptr = freelist.PopFront();
            Span* span = PageHeap::Instance()->GetSpanFromPageId(Span::PageIdFromPtr(ptr));
            assert(span->location == Span::IN_USE);
            assert(span->size_class == class_);

            if (span->freelist.Empty()) {
                RemoveFromList(span);
                InsertToList(&nonempty_, span);
            }

            span->refcount--;
            free_objects_++;
            span->freelist.PushFront(ptr);

            if (span->refcount == 0) {
                free_objects_ -= span->freelist.FreeObjects();
                RemoveFromList(span);
                PageHeap::Instance()->Delete(span);
            }
        }
        assert(CheckState());
    }